

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void Action_add(action **app,e_action type,symbol *sp,char *arg)

{
  action *paVar1;
  anon_union_8_2_743af1f4_for_x in_RCX;
  symbol *in_RDX;
  e_action in_ESI;
  undefined8 *in_RDI;
  action *newaction;
  
  paVar1 = Action_new();
  paVar1->next = (action *)*in_RDI;
  *in_RDI = paVar1;
  paVar1->type = in_ESI;
  paVar1->sp = in_RDX;
  paVar1->spOpt = (symbol *)0x0;
  if (in_ESI == SHIFT) {
    paVar1->x = in_RCX;
  }
  else {
    paVar1->x = in_RCX;
  }
  return;
}

Assistant:

void Action_add(
  struct action **app,
  enum e_action type,
  struct symbol *sp,
  char *arg
){
  struct action *newaction;
  newaction = Action_new();
  newaction->next = *app;
  *app = newaction;
  newaction->type = type;
  newaction->sp = sp;
  newaction->spOpt = 0;
  if( type==SHIFT ){
    newaction->x.stp = (struct state *)arg;
  }else{
    newaction->x.rp = (struct rule *)arg;
  }
}